

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_wstring_equal_array(void)

{
  size_type sVar1;
  basic_variable<std::allocator<char>_> *pbVar2;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  basic_variable<std::allocator<char>_> *local_668;
  basic_variable<std::allocator<char>_> *local_650;
  basic_variable<std::allocator<char>_> *local_638;
  basic_variable<std::allocator<char>_> *local_620;
  undefined1 local_611;
  basic_variable<std::allocator<char>_> *local_610;
  basic_variable<std::allocator<char>_> local_608;
  basic_variable<std::allocator<char>_> local_5d8;
  basic_variable<std::allocator<char>_> local_5a8;
  undefined1 local_578 [64];
  basic_variable<std::allocator<char>_> local_538;
  undefined1 local_503 [2];
  undefined1 local_501;
  basic_variable<std::allocator<char>_> *local_500;
  basic_variable<std::allocator<char>_> local_4f8;
  basic_variable<std::allocator<char>_> local_4c8;
  basic_variable<std::allocator<char>_> local_498;
  undefined1 local_468 [64];
  basic_variable<std::allocator<char>_> local_428;
  undefined1 local_3f3 [2];
  undefined1 local_3f1;
  basic_variable<std::allocator<char>_> *local_3f0;
  basic_variable<std::allocator<char>_> local_3e8;
  basic_variable<std::allocator<char>_> local_3b8;
  basic_variable<std::allocator<char>_> local_388;
  undefined1 local_358 [64];
  basic_variable<std::allocator<char>_> local_318;
  undefined1 local_2e3 [2];
  undefined1 local_2e1;
  basic_variable<std::allocator<char>_> *local_2e0;
  basic_variable<std::allocator<char>_> local_2d8;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  undefined1 local_248 [64];
  basic_variable<std::allocator<char>_> local_208;
  undefined1 local_1cb [2];
  undefined1 local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"");
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_a[0] = trial::dynamic::operator==(&local_48,&local_78);
  local_85[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") == array::make()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x98e,"void equality_suite::compare_wstring_equal_array()",local_a,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_b8,L"");
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_87[0] = trial::dynamic::operator!=(&local_b8,&local_e8);
  local_e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") != array::make()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x98f,"void equality_suite::compare_wstring_equal_array()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_128,L"bravo");
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_eb[0] = trial::dynamic::operator==(&local_128,&local_158);
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == array::make()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x990,"void equality_suite::compare_wstring_equal_array()",local_eb,&local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198,L"bravo");
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_15b[0] = trial::dynamic::operator!=(&local_198,&local_1c8);
  local_1c9 = 1;
  sVar1 = 0x991;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != array::make()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x991,"void equality_suite::compare_wstring_equal_array()",local_15b,&local_1c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_208,L"");
  local_2e0 = &local_2d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2e0,1);
  local_2e0 = &local_2a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2e0,2);
  local_2e0 = &local_278;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2e0,3);
  local_248._0_8_ = &local_2d8;
  local_248._8_8_ = 3;
  init._M_len = sVar1;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_248 + 0x10),
             (basic_array<std::allocator<char>_> *)local_248._0_8_,init);
  local_1cb[0] = trial::dynamic::operator==
                           (&local_208,(basic_variable<std::allocator<char>_> *)(local_248 + 0x10));
  local_2e1 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") == array::make({ 1, 2, 3 })","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x993,"void equality_suite::compare_wstring_equal_array()",local_1cb,&local_2e1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_248 + 0x10));
  pbVar2 = &local_2d8;
  local_620 = (basic_variable<std::allocator<char>_> *)local_248;
  do {
    local_620 = local_620 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_620);
  } while (local_620 != pbVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_318,L"");
  local_3f0 = &local_3e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3f0,1);
  local_3f0 = &local_3b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3f0,2);
  local_3f0 = &local_388;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3f0,3);
  local_358._0_8_ = &local_3e8;
  local_358._8_8_ = 3;
  init_00._M_len = (size_type)pbVar2;
  init_00._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_358 + 0x10),
             (basic_array<std::allocator<char>_> *)local_358._0_8_,init_00);
  local_2e3[0] = trial::dynamic::operator!=
                           (&local_318,(basic_variable<std::allocator<char>_> *)(local_358 + 0x10));
  local_3f1 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") != array::make({ 1, 2, 3 })","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x994,"void equality_suite::compare_wstring_equal_array()",local_2e3,&local_3f1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_358 + 0x10));
  pbVar2 = &local_3e8;
  local_638 = (basic_variable<std::allocator<char>_> *)local_358;
  do {
    local_638 = local_638 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_638);
  } while (local_638 != pbVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_428,L"bravo");
  local_500 = &local_4f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_500,1);
  local_500 = &local_4c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_500,2);
  local_500 = &local_498;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_500,3);
  local_468._0_8_ = &local_4f8;
  local_468._8_8_ = 3;
  init_01._M_len = (size_type)pbVar2;
  init_01._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_468 + 0x10),
             (basic_array<std::allocator<char>_> *)local_468._0_8_,init_01);
  local_3f3[0] = trial::dynamic::operator==
                           (&local_428,(basic_variable<std::allocator<char>_> *)(local_468 + 0x10));
  local_501 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == array::make({ 1, 2, 3 })","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x995,"void equality_suite::compare_wstring_equal_array()",local_3f3,&local_501);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_468 + 0x10));
  pbVar2 = &local_4f8;
  local_650 = (basic_variable<std::allocator<char>_> *)local_468;
  do {
    local_650 = local_650 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_650);
  } while (local_650 != pbVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_428);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_538,L"bravo");
  local_610 = &local_608;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_610,1);
  local_610 = &local_5d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_610,2);
  local_610 = &local_5a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_610,3);
  local_578._0_8_ = &local_608;
  local_578._8_8_ = 3;
  init_02._M_len = (size_type)pbVar2;
  init_02._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_578 + 0x10),
             (basic_array<std::allocator<char>_> *)local_578._0_8_,init_02);
  local_503[0] = trial::dynamic::operator!=
                           (&local_538,(basic_variable<std::allocator<char>_> *)(local_578 + 0x10));
  local_611 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != array::make({ 1, 2, 3 })","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x996,"void equality_suite::compare_wstring_equal_array()",local_503,&local_611);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_578 + 0x10));
  local_668 = (basic_variable<std::allocator<char>_> *)local_578;
  do {
    local_668 = local_668 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_668);
  } while (local_668 != &local_608);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_538);
  return;
}

Assistant:

void compare_wstring_equal_array()
{
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") == array::make(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") != array::make(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == array::make(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != array::make(), true);

    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") == array::make({ 1, 2, 3 }), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") != array::make({ 1, 2, 3 }), true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == array::make({ 1, 2, 3 }), false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != array::make({ 1, 2, 3 }), true);
}